

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.h
# Opt level: O2

void __thiscall
slang::ast::GenericClassDefSymbol::GenericClassDefSymbol
          (GenericClassDefSymbol *this,string_view name,SourceLocation loc,
          function_ref<void_(slang::ast::Compilation_&,_slang::ast::ClassType_&)> specializeFunc)

{
  (this->super_Symbol).kind = GenericClassDef;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).indexInScope = 0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  this->isInterface = false;
  (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_ =
       (pointer)(this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.
                firstElement;
  (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len = 0;
  (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.cap = 8;
  ska::detailv3::
  sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
  ::sherwood_v3_table(&(this->specMap).
                       super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                     );
  (this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged = false;
  this->firstForward = (ForwardingTypedefSymbol *)0x0;
  (this->specializeFunc).callback = specializeFunc.callback;
  (this->specializeFunc).callable = specializeFunc.callable;
  return;
}

Assistant:

GenericClassDefSymbol(string_view name, SourceLocation loc,
                          function_ref<void(Compilation&, ClassType&)> specializeFunc) :
        Symbol(SymbolKind::GenericClassDef, name, loc),
        specializeFunc{specializeFunc} {}